

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall miniros::TransportTCP::socketUpdate(TransportTCP *this,int events)

{
  void *logger_handle;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  socklen_t *in_RCX;
  sockaddr *__addr;
  uint in_ESI;
  long *in_RDI;
  bool enabled_1;
  bool enabled;
  socklen_t len;
  uint32_t error;
  TransportTCPPtr transport;
  scoped_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffed8;
  Level LVar4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  LogLocation *in_stack_fffffffffffffef0;
  Level in_stack_ffffffffffffff04;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  LogLocation *in_stack_ffffffffffffff10;
  LogLocation *loc;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  LogLocation local_b9 [2];
  undefined1 local_92;
  undefined1 local_91 [33];
  socklen_t local_70;
  int local_6c [13];
  int local_24;
  undefined4 local_14;
  
  local_14 = in_ESI;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  if ((*(byte *)((long)in_RDI + 0x9c) & 1) == 0) {
    if (((local_14 & 1) != 0) && ((*(byte *)(in_RDI + 0x19) & 1) != 0)) {
      if ((*(byte *)((long)in_RDI + 0xca) & 1) == 0) {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        if (bVar1) {
          std::enable_shared_from_this<miniros::Transport>::shared_from_this
                    ((enable_shared_from_this<miniros::Transport> *)in_stack_fffffffffffffed8);
          std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator()
                    ((function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (shared_ptr<miniros::Transport> *)in_stack_fffffffffffffed8);
          std::shared_ptr<miniros::Transport>::~shared_ptr
                    ((shared_ptr<miniros::Transport> *)0x50f13b);
        }
      }
      else {
        accept((TransportTCP *)&stack0xffffffffffffffc8,(int)in_RDI,__addr,in_RCX);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8);
        if (bVar1) {
          std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::operator()
                    ((function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (shared_ptr<miniros::TransportTCP> *)in_stack_fffffffffffffed8);
        }
        std::shared_ptr<miniros::TransportTCP>::~shared_ptr
                  ((shared_ptr<miniros::TransportTCP> *)0x50f0dd);
      }
    }
    if ((((local_14 & 4) != 0) && ((*(byte *)((long)in_RDI + 0xc9) & 1) != 0)) &&
       (bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)), bVar1)) {
      std::enable_shared_from_this<miniros::Transport>::shared_from_this
                ((enable_shared_from_this<miniros::Transport> *)in_stack_fffffffffffffed8);
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator()
                ((function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (shared_ptr<miniros::Transport> *)in_stack_fffffffffffffed8);
      std::shared_ptr<miniros::Transport>::~shared_ptr((shared_ptr<miniros::Transport> *)0x50f1e5);
    }
    local_24 = 0;
  }
  else {
    local_24 = 1;
  }
  LVar4 = (Level)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x50f227);
  if ((local_24 == 0) &&
     ((((local_14 & 8) != 0 || ((local_14 & 0x10) != 0)) ||
      (((local_14 & 0x2000) != 0 || ((local_14 & 0x20) != 0)))))) {
    local_6c[0] = -1;
    local_70 = 4;
    iVar2 = getsockopt((int)in_RDI[0x13],1,4,local_6c,&local_70);
    if (iVar2 < 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((socketUpdate::loc.initialized_ ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff20,
                   (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                   (allocator<char> *)in_stack_ffffffffffffff10);
        console::initializeLogLocation
                  (in_stack_ffffffffffffff10,
                   (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04);
        std::__cxx11::string::~string((string *)(local_91 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_91);
      }
      if (socketUpdate::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   LVar4);
        console::checkLogLocationEnabled(in_stack_fffffffffffffef0);
      }
      in_stack_ffffffffffffff1f = (socketUpdate::loc.logger_enabled_ & 1U) != 0;
      local_92 = in_stack_ffffffffffffff1f;
      if ((bool)in_stack_ffffffffffffff1f) {
        in_stack_fffffffffffffee0 = (undefined4)in_RDI[0x13];
        LVar4 = Debug;
        console::print((FilterBase *)0x0,socketUpdate::loc.logger_,
                       (Level)(ulong)socketUpdate::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x2cd,"void miniros::TransportTCP::socketUpdate(int)");
      }
    }
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((socketUpdate(int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
      loc = local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 (allocator<char> *)loc);
      console::initializeLogLocation
                (loc,(string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04);
      std::__cxx11::string::~string((string *)&local_b9[0].logger_enabled_);
      std::allocator<char>::~allocator((allocator<char> *)local_b9);
    }
    if (socketUpdate(int)::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),LVar4)
      ;
      console::checkLogLocationEnabled(in_stack_fffffffffffffef0);
    }
    logger_handle = socketUpdate(int)::loc.logger_;
    LVar4 = socketUpdate(int)::loc.level_;
    if ((socketUpdate(int)::loc.logger_enabled_ & 1U) != 0) {
      uVar5 = (undefined4)in_RDI[0x13];
      pcVar3 = strerror(local_6c[0]);
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x2d4,"void miniros::TransportTCP::socketUpdate(int)",
                     "Socket %d closed with (ERR|HUP|NVAL) events %d: %s",uVar5,local_14,pcVar3);
    }
    (**(code **)(*in_RDI + 0x40))();
  }
  return;
}

Assistant:

void TransportTCP::socketUpdate(int events)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);
    if (closed_)
    {
      return;
    }

    // Handle read events before err/hup/nval, since there may be data left on the wire
    if ((events & POLLIN) && expecting_read_)
    {
      if (is_server_)
      {
        // Should not block here, because poll() said that it's ready
        // for reading
        TransportTCPPtr transport = accept();
        if (transport)
        {
          MINIROS_ASSERT(accept_cb_);
          accept_cb_(transport);
        }
      }
      else
      {
        if (read_cb_)
        {
          read_cb_(shared_from_this());
        }
      }
    }

    if ((events & POLLOUT) && expecting_write_)
    {
      if (write_cb_)
      {
        write_cb_(shared_from_this());
      }
    }
  }

  if((events & POLLERR) ||
     (events & POLLHUP) ||
#if defined(POLLRDHUP) // POLLRDHUP is not part of POSIX!
     (events & POLLRDHUP) ||
#endif
     (events & POLLNVAL))
  {
    uint32_t error = -1;
    socklen_t len = sizeof(error);
    if (getsockopt(sock_, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&error), &len) < 0)
    {
      MINIROS_DEBUG("getsockopt failed on socket [%d]", sock_);
    }
  #ifdef _MSC_VER
    char err[60];
    strerror_s(err,60,error);
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, err);
  #else
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, strerror(error));
  #endif

    close();
  }
}